

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_chacha20poly1305.cc
# Opt level: O0

int aead_chacha20_poly1305_init(EVP_AEAD_CTX *ctx,uint8_t *key,size_t key_len,size_t tag_len)

{
  aead_chacha20_poly1305_ctx *c20_ctx;
  size_t tag_len_local;
  size_t key_len_local;
  uint8_t *key_local;
  EVP_AEAD_CTX *ctx_local;
  
  c20_ctx = (aead_chacha20_poly1305_ctx *)tag_len;
  if (tag_len == 0) {
    c20_ctx = (aead_chacha20_poly1305_ctx *)0x10;
  }
  if (c20_ctx < (aead_chacha20_poly1305_ctx *)0x11) {
    if (key_len == 0x20) {
      OPENSSL_memcpy(&ctx->state,key,0x20);
      ctx->tag_len = (uint8_t)c20_ctx;
      ctx_local._4_4_ = 1;
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ERR_put_error(0x1e,0,0x75,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_chacha20poly1305.cc"
                  ,0x34);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int aead_chacha20_poly1305_init(EVP_AEAD_CTX *ctx, const uint8_t *key,
                                       size_t key_len, size_t tag_len) {
  struct aead_chacha20_poly1305_ctx *c20_ctx =
      (struct aead_chacha20_poly1305_ctx *)&ctx->state;

  if (tag_len == 0) {
    tag_len = POLY1305_TAG_LEN;
  }

  if (tag_len > POLY1305_TAG_LEN) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TOO_LARGE);
    return 0;
  }

  if (key_len != sizeof(c20_ctx->key)) {
    return 0;  // internal error - EVP_AEAD_CTX_init should catch this.
  }

  OPENSSL_memcpy(c20_ctx->key, key, key_len);
  ctx->tag_len = tag_len;

  return 1;
}